

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O1

Split * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::find_template<false>
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,PrimInfoRange *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  BBox3fa *pBVar1;
  int *piVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  PrimRef *pPVar5;
  Geometry *pGVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  float fVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  size_t sVar21;
  float *pfVar22;
  float fVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  uint uVar32;
  uint uVar33;
  undefined1 auVar31 [16];
  uint uVar34;
  uint uVar35;
  uint uVar36;
  float fVar37;
  float fVar41;
  float fVar42;
  undefined1 auVar38 [16];
  float fVar44;
  undefined1 auVar39 [16];
  uint uVar43;
  undefined1 auVar40 [16];
  float fVar45;
  uint uVar46;
  uint uVar47;
  float fVar48;
  float fVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  undefined1 auVar54 [16];
  float fVar56;
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  vuint4 vbestPos;
  BinBoundsAndCenter binBoundsAndCenter;
  BinMapping<32UL> mapping;
  BBox3fa bounds;
  Binner binner;
  vuint4 rCounts [32];
  undefined1 local_1380 [16];
  undefined1 local_1370 [8];
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  Scene *local_12f0;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  size_t local_12b0;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float local_1290 [7];
  float fStack_1274;
  float local_1270 [120];
  undefined1 auStack_1090 [16];
  undefined8 local_1080 [2];
  undefined1 local_1070 [16];
  undefined1 local_1060 [16];
  undefined1 local_1050 [16];
  undefined1 local_1040 [16];
  undefined1 local_1030 [2976];
  int aiStack_490 [4];
  undefined8 local_480;
  int local_478 [122];
  int aiStack_290 [8];
  int aiStack_270 [144];
  
  lVar12 = 0xc00;
  pauVar16 = (undefined1 (*) [16])local_1030;
  do {
    pauVar16[-1] = _DAT_01feb9f0;
    *pauVar16 = _DAT_01feba00;
    pauVar16[-3] = _DAT_01feb9f0;
    pauVar16[-2] = _DAT_01feba00;
    pauVar16[-5] = _DAT_01feb9f0;
    pauVar16[-4] = _DAT_01feba00;
    *(undefined8 *)((long)local_1080 + lVar12) = 0;
    *(undefined8 *)((long)local_1080 + lVar12 + 8) = 0;
    lVar12 = lVar12 + 0x10;
    pauVar16 = pauVar16 + 6;
  } while (lVar12 != 0xe00);
  uVar3 = (set->super_range<unsigned_long>)._begin;
  uVar4 = (set->super_range<unsigned_long>)._end;
  fVar23 = (float)(uVar4 - uVar3) * 0.05 + 4.0;
  uVar13 = (ulong)fVar23;
  uVar13 = (long)(fVar23 - 9.223372e+18) & (long)uVar13 >> 0x3f | uVar13;
  sVar21 = 0x20;
  if (uVar13 < 0x20) {
    sVar21 = uVar13;
  }
  pBVar1 = &(set->super_CentGeomBBox3fa).centBounds;
  fVar23 = (pBVar1->lower).field_0.m128[0];
  fVar45 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  uVar9 = *(undefined8 *)&(pBVar1->lower).field_0;
  pfVar22 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128 + 2;
  fVar48 = *pfVar22;
  fVar49 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  uVar10 = *(undefined8 *)pfVar22;
  auVar28._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - fVar23;
  auVar28._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fVar45;
  auVar28._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fVar48;
  auVar28._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fVar49;
  auVar39._0_4_ = (float)(long)sVar21 * 0.99;
  auVar38 = maxps(_DAT_01fecb10,auVar28);
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar28 = divps(auVar39,auVar38);
  fVar37 = (float)(-(uint)((float)DAT_01fecb10 < auVar38._0_4_) & auVar28._0_4_);
  fVar41 = (float)(-(uint)(DAT_01fecb10._4_4_ < auVar38._4_4_) & auVar28._4_4_);
  fVar42 = (float)(-(uint)(DAT_01fecb10._8_4_ < auVar38._8_4_) & auVar28._8_4_);
  fVar44 = (float)(-(uint)(DAT_01fecb10._12_4_ < auVar38._12_4_) & auVar28._12_4_);
  local_1290[0] = fVar37;
  local_1290[1] = fVar41;
  local_1290[2] = fVar42;
  local_12f0 = this->scene;
  local_12e0 = *(undefined8 *)&(space->vx).field_0;
  uStack_12d8 = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_12d0 = *(undefined8 *)&(space->vy).field_0;
  uStack_12c8 = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_12c0 = *(undefined8 *)&(space->vz).field_0;
  uStack_12b8 = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  uVar20 = uVar4 - uVar3;
  if (uVar20 != 0) {
    pPVar5 = this->prims;
    local_12b0 = sVar21;
    local_12a0 = fVar23;
    fStack_129c = fVar45;
    fStack_1298 = fVar48;
    fStack_1294 = fVar49;
    local_1290[3] = fVar44;
    if (uVar20 == 1) {
      uVar18 = 0;
    }
    else {
      local_1380._4_4_ = (int)sVar21 - 1;
      local_1380._0_4_ = local_1380._4_4_;
      local_1380._8_4_ = local_1380._4_4_;
      local_1380._12_4_ = local_1380._4_4_;
      pfVar22 = pPVar5[uVar3 + 1].upper.field_0.m128 + 3;
      uVar18 = 0;
      do {
        pGVar6 = (local_12f0->geometries).items[(uint)pfVar22[-0xc]].ptr;
        (*(pGVar6->super_RefCount)._vptr_RefCount[0x3a])
                  (local_1290 + 4,pGVar6,&local_12e0,(ulong)(uint)pfVar22[-8]);
        fVar11 = local_1270[3];
        fVar58 = local_1270[2];
        fVar57 = local_1270[1];
        fVar56 = local_1270[0];
        local_1370._4_4_ = local_1290[5];
        local_1370._0_4_ = local_1290[4];
        fStack_1368 = local_1290[6];
        fStack_1364 = fStack_1274;
        auVar55._0_4_ = (int)(((local_1290[4] + local_1270[0]) - fVar23) * fVar37 + -0.5);
        auVar55._4_4_ = (int)(((local_1290[5] + local_1270[1]) - fVar45) * fVar41 + -0.5);
        auVar55._8_4_ = (int)(((local_1290[6] + local_1270[2]) - fVar48) * fVar42 + -0.5);
        auVar55._12_4_ = (int)(((fStack_1274 + local_1270[3]) - fVar49) * fVar44 + -0.5);
        auVar29._0_4_ = -(uint)((int)local_1380._4_4_ < auVar55._0_4_);
        auVar29._4_4_ = -(uint)((int)local_1380._4_4_ < auVar55._4_4_);
        auVar29._8_4_ = -(uint)((int)local_1380._4_4_ < auVar55._8_4_);
        auVar29._12_4_ = -(uint)((int)local_1380._4_4_ < auVar55._12_4_);
        local_1300 = ~auVar29 & auVar55 | local_1380 & auVar29;
        auVar31._0_4_ = -(uint)(0 < local_1300._0_4_);
        auVar31._4_4_ = -(uint)(0 < local_1300._4_4_);
        auVar31._8_4_ = -(uint)(0 < local_1300._8_4_);
        auVar31._12_4_ = -(uint)(0 < local_1300._12_4_);
        local_1300 = auVar31 & local_1300;
        pGVar6 = (local_12f0->geometries).items[(uint)pfVar22[-4]].ptr;
        (*(pGVar6->super_RefCount)._vptr_RefCount[0x3a])
                  (local_1290 + 4,pGVar6,&local_12e0,(ulong)(uint)*pfVar22);
        auVar40._4_4_ = local_1290[5];
        auVar40._0_4_ = local_1290[4];
        auVar40._8_4_ = local_1290[6];
        auVar40._12_4_ = fStack_1274;
        auVar54._4_4_ = local_1270[1];
        auVar54._0_4_ = local_1270[0];
        auVar54._8_4_ = local_1270[2];
        auVar54._12_4_ = local_1270[3];
        uVar14 = (ulong)(uint)local_1300._0_4_;
        *(int *)(&local_480 + uVar14 * 2) = *(int *)(&local_480 + uVar14 * 2) + 1;
        auVar28 = minps(*(undefined1 (*) [16])(local_1080 + uVar14 * 0xc),_local_1370);
        auVar38._4_4_ = fVar57;
        auVar38._0_4_ = fVar56;
        auVar38._8_4_ = fVar58;
        auVar38._12_4_ = fVar11;
        auVar39 = maxps(*(undefined1 (*) [16])(local_1070 + uVar14 * 0x60),auVar38);
        *(undefined1 (*) [16])(local_1080 + uVar14 * 0xc) = auVar28;
        lVar12 = (ulong)(uint)local_1300._4_4_ * 0x60;
        *(undefined1 (*) [16])(local_1070 + uVar14 * 0x60) = auVar39;
        piVar2 = (int *)((long)&local_480 + (ulong)(uint)local_1300._4_4_ * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        uVar30 = (uint)(((local_1290[4] + local_1270[0]) - fVar23) * fVar37 + -0.5);
        uVar32 = (uint)(((local_1290[5] + local_1270[1]) - fVar45) * fVar41 + -0.5);
        uVar33 = (uint)(((local_1290[6] + local_1270[2]) - fVar48) * fVar42 + -0.5);
        auVar28 = minps(*(undefined1 (*) [16])(local_1060 + lVar12),_local_1370);
        *(undefined1 (*) [16])(local_1060 + lVar12) = auVar28;
        auVar28 = maxps(*(undefined1 (*) [16])(local_1050 + lVar12),auVar38);
        uVar34 = -(uint)((int)local_1380._4_4_ < (int)uVar30);
        uVar35 = -(uint)((int)local_1380._4_4_ < (int)uVar32);
        uVar36 = -(uint)((int)local_1380._4_4_ < (int)uVar33);
        *(undefined1 (*) [16])(local_1050 + lVar12) = auVar28;
        lVar12 = (ulong)(uint)local_1300._8_4_ * 0x60;
        local_478[(ulong)(uint)local_1300._8_4_ * 4] =
             local_478[(ulong)(uint)local_1300._8_4_ * 4] + 1;
        uVar30 = ~uVar34 & uVar30 | local_1380._4_4_ & uVar34;
        uVar32 = ~uVar35 & uVar32 | local_1380._4_4_ & uVar35;
        uVar33 = ~uVar36 & uVar33 | local_1380._4_4_ & uVar36;
        auVar39 = minps(*(undefined1 (*) [16])(local_1040 + lVar12),_local_1370);
        auVar28 = maxps(*(undefined1 (*) [16])(local_1030 + lVar12),auVar38);
        *(undefined1 (*) [16])(local_1040 + lVar12) = auVar39;
        uVar15 = (ulong)(-(uint)(0 < (int)uVar30) & uVar30);
        *(undefined1 (*) [16])(local_1030 + lVar12) = auVar28;
        *(int *)(&local_480 + uVar15 * 2) = *(int *)(&local_480 + uVar15 * 2) + 1;
        auVar28 = minps(*(undefined1 (*) [16])(local_1080 + uVar15 * 0xc),auVar40);
        auVar39 = maxps(*(undefined1 (*) [16])(local_1070 + uVar15 * 0x60),auVar54);
        *(undefined1 (*) [16])(local_1080 + uVar15 * 0xc) = auVar28;
        uVar14 = (ulong)(-(uint)(0 < (int)uVar32) & uVar32);
        lVar12 = uVar14 * 0x60;
        *(undefined1 (*) [16])(local_1070 + uVar15 * 0x60) = auVar39;
        piVar2 = (int *)((long)&local_480 + uVar14 * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        auVar28 = minps(*(undefined1 (*) [16])(local_1060 + lVar12),auVar40);
        auVar39 = maxps(*(undefined1 (*) [16])(local_1050 + lVar12),auVar54);
        *(undefined1 (*) [16])(local_1060 + lVar12) = auVar28;
        uVar14 = (ulong)(-(uint)(0 < (int)uVar33) & uVar33);
        lVar17 = uVar14 * 0x60;
        *(undefined1 (*) [16])(local_1050 + lVar12) = auVar39;
        local_478[uVar14 * 4] = local_478[uVar14 * 4] + 1;
        auVar28 = minps(*(undefined1 (*) [16])(local_1040 + lVar17),auVar40);
        auVar39 = maxps(*(undefined1 (*) [16])(local_1030 + lVar17),auVar54);
        *(undefined1 (*) [16])(local_1040 + lVar17) = auVar28;
        *(undefined1 (*) [16])(local_1030 + lVar17) = auVar39;
        uVar18 = uVar18 + 2;
        pfVar22 = pfVar22 + 0x10;
      } while (uVar18 < uVar20 - 1);
    }
    if (uVar18 < uVar20) {
      pGVar6 = (local_12f0->geometries).items[(uint)pPVar5[uVar3 + uVar18].lower.field_0.m128[3]].
               ptr;
      (*(pGVar6->super_RefCount)._vptr_RefCount[0x3a])
                (local_1290 + 4,pGVar6,&local_12e0,
                 (ulong)(uint)pPVar5[uVar3 + uVar18].upper.field_0.m128[3]);
      auVar7._4_4_ = local_1290[5];
      auVar7._0_4_ = local_1290[4];
      auVar7._8_4_ = local_1290[6];
      auVar7._12_4_ = fStack_1274;
      auVar8._4_4_ = local_1270[1];
      auVar8._0_4_ = local_1270[0];
      auVar8._8_4_ = local_1270[2];
      auVar8._12_4_ = local_1270[3];
      uVar32 = (uint)(((local_1290[4] + local_1270[0]) - fVar23) * fVar37 + -0.5);
      uVar33 = (uint)(((local_1290[5] + local_1270[1]) - fVar45) * fVar41 + -0.5);
      uVar34 = (uint)(((local_1290[6] + local_1270[2]) - fVar48) * fVar42 + -0.5);
      uVar30 = (int)sVar21 - 1;
      uVar35 = -(uint)((int)uVar30 < (int)uVar32);
      uVar36 = -(uint)((int)uVar30 < (int)uVar33);
      uVar43 = -(uint)((int)uVar30 < (int)uVar34);
      uVar32 = ~uVar35 & uVar32 | uVar30 & uVar35;
      uVar33 = ~uVar36 & uVar33 | uVar30 & uVar36;
      uVar30 = ~uVar43 & uVar34 | uVar30 & uVar43;
      uVar20 = (ulong)(-(uint)(0 < (int)uVar32) & uVar32);
      *(int *)(&local_480 + uVar20 * 2) = *(int *)(&local_480 + uVar20 * 2) + 1;
      auVar28 = *(undefined1 (*) [16])(local_1070 + uVar20 * 0x60);
      auVar39 = minps(*(undefined1 (*) [16])(local_1080 + uVar20 * 0xc),auVar7);
      *(undefined1 (*) [16])(local_1080 + uVar20 * 0xc) = auVar39;
      auVar28 = maxps(auVar28,auVar8);
      *(undefined1 (*) [16])(local_1070 + uVar20 * 0x60) = auVar28;
      uVar20 = (ulong)(-(uint)(0 < (int)uVar33) & uVar33);
      lVar12 = uVar20 * 0x60;
      piVar2 = (int *)((long)&local_480 + uVar20 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      auVar28 = minps(*(undefined1 (*) [16])(local_1060 + lVar12),auVar7);
      *(undefined1 (*) [16])(local_1060 + lVar12) = auVar28;
      auVar28 = maxps(*(undefined1 (*) [16])(local_1050 + lVar12),auVar8);
      *(undefined1 (*) [16])(local_1050 + lVar12) = auVar28;
      uVar20 = (ulong)(-(uint)(0 < (int)uVar30) & uVar30);
      lVar12 = uVar20 * 0x60;
      local_478[uVar20 * 4] = local_478[uVar20 * 4] + 1;
      auVar28 = minps(*(undefined1 (*) [16])(local_1040 + lVar12),auVar7);
      *(undefined1 (*) [16])(local_1040 + lVar12) = auVar28;
      auVar28 = maxps(*(undefined1 (*) [16])(local_1030 + lVar12),auVar8);
      *(undefined1 (*) [16])(local_1030 + lVar12) = auVar28;
    }
  }
  lVar12 = sVar21 - 1;
  if (lVar12 != 0) {
    lVar17 = sVar21 * 0x10;
    pauVar16 = (undefined1 (*) [16])(auStack_1090 + sVar21 * 0x60);
    iVar24 = 0;
    iVar25 = 0;
    iVar26 = 0;
    iVar27 = 0;
    lVar19 = 0;
    auVar28 = _DAT_01feba00;
    auVar39 = _DAT_01feb9f0;
    auVar38 = _DAT_01feba00;
    auVar40 = _DAT_01feb9f0;
    auVar54 = _DAT_01feb9f0;
    auVar55 = _DAT_01feba00;
    do {
      piVar2 = (int *)((long)aiStack_490 + lVar19 + lVar17);
      iVar24 = iVar24 + *piVar2;
      iVar25 = iVar25 + piVar2[1];
      iVar26 = iVar26 + piVar2[2];
      iVar27 = iVar27 + piVar2[3];
      auVar54 = minps(auVar54,pauVar16[-5]);
      auVar55 = maxps(auVar55,pauVar16[-4]);
      auVar39 = minps(auVar39,pauVar16[-3]);
      fVar23 = auVar55._4_4_ - auVar54._4_4_;
      fVar45 = auVar55._8_4_ - auVar54._8_4_;
      auVar28 = maxps(auVar28,pauVar16[-2]);
      fVar48 = auVar28._4_4_ - auVar39._4_4_;
      fVar49 = auVar28._8_4_ - auVar39._8_4_;
      auVar40 = minps(auVar40,pauVar16[-1]);
      auVar38 = maxps(auVar38,*pauVar16);
      *(ulong *)((long)local_1290 + lVar19 + lVar17) =
           CONCAT44((auVar28._0_4_ - auVar39._0_4_) * (fVar48 + fVar49) + fVar49 * fVar48,
                    (auVar55._0_4_ - auVar54._0_4_) * (fVar23 + fVar45) + fVar45 * fVar23);
      fVar23 = auVar38._4_4_ - auVar40._4_4_;
      fVar45 = auVar38._8_4_ - auVar40._8_4_;
      *(float *)((long)local_1290 + lVar19 + lVar17 + 8) =
           (fVar23 + fVar45) * (auVar38._0_4_ - auVar40._0_4_) + fVar45 * fVar23;
      *(undefined4 *)((long)local_1290 + lVar19 + lVar17 + 0xc) = 0;
      piVar2 = (int *)((long)aiStack_290 + lVar19 + lVar17);
      *piVar2 = iVar24;
      piVar2[1] = iVar25;
      piVar2[2] = iVar26;
      piVar2[3] = iVar27;
      lVar19 = lVar19 + -0x10;
      pauVar16 = pauVar16 + -6;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  uVar20 = 0xffffffffffffffff;
  local_1310 = _DAT_01feb9f0;
  local_1320._0_4_ = 0;
  local_1320._4_4_ = 0;
  local_1320._8_4_ = 0;
  local_1320._12_4_ = 0;
  local_1320 = (undefined1  [16])0x0;
  if (1 < uVar13) {
    uVar30 = ~(-1 << ((byte)logBlockSize & 0x1f));
    pauVar16 = (undefined1 (*) [16])local_1030;
    uVar32 = 1;
    uVar33 = 1;
    uVar34 = 1;
    uVar35 = 1;
    iVar24 = 0;
    iVar25 = 0;
    iVar26 = 0;
    iVar27 = 0;
    lVar12 = 0;
    local_1320._0_4_ = 0;
    local_1320._4_4_ = 0;
    local_1320._8_4_ = 0;
    local_1320._12_4_ = 0;
    auVar28 = _DAT_01feba00;
    auVar39 = _DAT_01feb9f0;
    auVar38 = _DAT_01feba00;
    auVar40 = _DAT_01feba00;
    auVar54 = _DAT_01feb9f0;
    auVar55 = _DAT_01feb9f0;
    do {
      auVar39 = minps(auVar39,pauVar16[-5]);
      auVar28 = maxps(auVar28,pauVar16[-4]);
      auVar54 = minps(auVar54,pauVar16[-3]);
      auVar40 = maxps(auVar40,pauVar16[-2]);
      fVar57 = auVar28._4_4_ - auVar39._4_4_;
      fVar58 = auVar28._8_4_ - auVar39._8_4_;
      auVar55 = minps(auVar55,pauVar16[-1]);
      fVar23 = auVar40._4_4_ - auVar54._4_4_;
      fVar45 = auVar40._8_4_ - auVar54._8_4_;
      auVar38 = maxps(auVar38,*pauVar16);
      fVar48 = auVar38._0_4_ - auVar55._0_4_;
      fVar49 = auVar38._4_4_ - auVar55._4_4_;
      fVar56 = auVar38._8_4_ - auVar55._8_4_;
      iVar24 = iVar24 + *(int *)((long)&local_480 + lVar12);
      iVar25 = iVar25 + *(int *)((long)&local_480 + lVar12 + 4);
      iVar26 = iVar26 + *(int *)((long)local_478 + lVar12);
      iVar27 = iVar27 + *(int *)((long)local_478 + lVar12 + 4);
      local_1370 = (undefined1  [8])(logBlockSize & 0xffffffff);
      uVar36 = iVar24 + uVar30 >> (long)local_1370;
      uVar43 = iVar25 + uVar30 >> (long)local_1370;
      uVar46 = iVar26 + uVar30 >> (long)local_1370;
      uVar47 = iVar27 + uVar30 >> (long)local_1370;
      uVar50 = *(int *)((long)aiStack_270 + lVar12) + uVar30 >> (long)local_1370;
      uVar51 = *(int *)((long)aiStack_270 + lVar12 + 4) + uVar30 >> (long)local_1370;
      uVar52 = *(int *)((long)aiStack_270 + lVar12 + 8) + uVar30 >> (long)local_1370;
      uVar53 = *(int *)((long)aiStack_270 + lVar12 + 0xc) + uVar30 >> (long)local_1370;
      auVar59._0_4_ =
           ((float)(uVar50 & 0x7fffffff) + (float)((int)uVar50 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar12) +
           ((float)(uVar36 & 0x7fffffff) + (float)((int)uVar36 >> 0x1f & 0x4f000000)) *
           ((auVar28._0_4_ - auVar39._0_4_) * (fVar57 + fVar58) + fVar58 * fVar57);
      auVar59._4_4_ =
           ((float)(uVar51 & 0x7fffffff) + (float)((int)uVar51 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar12 + 4) +
           ((float)(uVar43 & 0x7fffffff) + (float)((int)uVar43 >> 0x1f & 0x4f000000)) *
           ((auVar40._0_4_ - auVar54._0_4_) * (fVar23 + fVar45) + fVar45 * fVar23);
      auVar59._8_4_ =
           ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar12 + 8) +
           ((float)(uVar46 & 0x7fffffff) + (float)((int)uVar46 >> 0x1f & 0x4f000000)) *
           (fVar48 * (fVar56 + fVar49) + fVar49 * fVar56);
      auVar59._12_4_ =
           ((float)(uVar53 & 0x7fffffff) + (float)((int)uVar53 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar12 + 0xc) +
           ((float)(uVar47 & 0x7fffffff) + (float)((int)uVar47 >> 0x1f & 0x4f000000)) *
           (fVar48 * (fVar49 + fVar56) + fVar56 * fVar49);
      uVar36 = -(uint)(local_1310._0_4_ <= auVar59._0_4_);
      uVar43 = -(uint)(local_1310._4_4_ <= auVar59._4_4_);
      uVar46 = -(uint)(local_1310._8_4_ <= auVar59._8_4_);
      uVar47 = -(uint)(local_1310._12_4_ <= auVar59._12_4_);
      local_1320._0_4_ = ~uVar36 & uVar32 | local_1320._0_4_ & uVar36;
      local_1320._4_4_ = ~uVar43 & uVar33 | local_1320._4_4_ & uVar43;
      local_1320._8_4_ = ~uVar46 & uVar34 | local_1320._8_4_ & uVar46;
      local_1320._12_4_ = ~uVar47 & uVar35 | local_1320._12_4_ & uVar47;
      local_1310 = minps(auVar59,local_1310);
      uVar32 = uVar32 + 1;
      uVar33 = uVar33 + 1;
      uVar34 = uVar34 + 1;
      uVar35 = uVar35 + 1;
      pauVar16 = pauVar16 + 6;
      lVar12 = lVar12 + 0x10;
    } while (sVar21 * 0x10 + -0x10 != lVar12);
  }
  fVar23 = INFINITY;
  uVar13 = 0;
  iVar24 = 0;
  do {
    if ((((local_1290[uVar13] != 0.0) || (NAN(local_1290[uVar13]))) &&
        (*(float *)(local_1310 + uVar13 * 4) < fVar23)) && (*(int *)(local_1320 + uVar13 * 4) != 0))
    {
      uVar20 = uVar13 & 0xffffffff;
      iVar24 = *(int *)(local_1320 + uVar13 * 4);
      fVar23 = *(float *)(local_1310 + uVar13 * 4);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  __return_storage_ptr__->sah = fVar23;
  __return_storage_ptr__->dim = (int)uVar20;
  (__return_storage_ptr__->field_2).pos = iVar24;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = sVar21;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar9;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar10;
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(fVar41,fVar37);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = CONCAT44(fVar44,fVar42);
  return __return_storage_ptr__;
}

Assistant:

const Split find_template(const PrimInfoRange& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          Binner binner(empty);
          const BinMapping<BINS> mapping(set);
          BinBoundsAndCenter binBoundsAndCenter(scene,space);
          bin_serial_or_parallel<parallel>(binner,prims,set.begin(),set.end(),size_t(4096),mapping,binBoundsAndCenter);
          return binner.best(mapping,logBlockSize);
        }